

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcMap.c
# Opt level: O3

int * Abc_NtkOutputMiniMapping(Abc_Frame_t *pAbc)

{
  int *piVar1;
  Abc_Ntk_t *pNtk;
  Abc_NtkFunc_t *pAVar2;
  Vec_Int_t *__ptr;
  
  if (pAbc == (Abc_Frame_t *)0x0) {
    puts("ABC framework is not initialized by calling Abc_Start()");
  }
  pNtk = Abc_FrameReadNtk(pAbc);
  if (pNtk == (Abc_Ntk_t *)0x0) {
    puts("Current network in ABC framework is not defined.");
    pAVar2 = (Abc_NtkFunc_t *)&DAT_00000004;
  }
  else {
    pAVar2 = &pNtk->ntkFunc;
  }
  if (*pAVar2 != ABC_FUNC_MAP) {
    puts("Current network in ABC framework is not mapped.");
  }
  __ptr = Abc_NtkWriteMiniMapping(pNtk);
  piVar1 = __ptr->pArray;
  free(__ptr);
  return piVar1;
}

Assistant:

int * Abc_NtkOutputMiniMapping( Abc_Frame_t * pAbc )
{
    //Abc_Frame_t * pAbc = (Abc_Frame_t *)pAbc0;
    Abc_Ntk_t * pNtk;
    Vec_Int_t * vMapping;
    int * pArray;
    if ( pAbc == NULL )
        printf( "ABC framework is not initialized by calling Abc_Start()\n" );
    pNtk = Abc_FrameReadNtk( pAbc );
    if ( pNtk == NULL )
        printf( "Current network in ABC framework is not defined.\n" );
    if ( !Abc_NtkHasMapping(pNtk) )
        printf( "Current network in ABC framework is not mapped.\n" );
    // derive mini-mapping
    vMapping = Abc_NtkWriteMiniMapping( pNtk );
    pArray = Vec_IntArray( vMapping );
    ABC_FREE( vMapping );
    // print mini-mapping (optional)
//    Abc_NtkPrintMiniMapping( pArray );
    // return the array representation of mini-mapping
    return pArray;
}